

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O2

ares_status_t
ares_query_nolock(ares_channel_t *channel,char *name,ares_dns_class_t dnsclass,
                 ares_dns_rec_type_t type,ares_callback_dnsrec callback,void *arg,
                 unsigned_short *qid)

{
  ares_status_t aVar1;
  size_t max_udp_size;
  undefined8 *arg_00;
  ares_dns_record_t *dnsrec;
  
  dnsrec = (ares_dns_record_t *)0x0;
  if ((name == (char *)0x0 || channel == (ares_channel_t *)0x0) ||
      callback == (ares_callback_dnsrec)0x0) {
    aVar1 = ARES_EFORMERR;
    if (callback == (ares_callback_dnsrec)0x0) {
      return ARES_EFORMERR;
    }
  }
  else {
    if ((channel->flags >> 8 & 1) == 0) {
      max_udp_size = 0;
    }
    else {
      max_udp_size = channel->ednspsz;
    }
    aVar1 = ares_dns_record_create_query
                      (&dnsrec,name,dnsclass,type,0,~channel->flags & ARES_FLAG_RD,max_udp_size);
    if (aVar1 == ARES_SUCCESS) {
      arg_00 = (undefined8 *)ares_malloc(0x10);
      if (arg_00 == (undefined8 *)0x0) {
        aVar1 = ARES_ENOMEM;
        (*callback)(arg,ARES_ENOMEM,0,(ares_dns_record_t *)0x0);
      }
      else {
        *arg_00 = callback;
        arg_00[1] = arg;
        aVar1 = ares_send_nolock(channel,(ares_server_t *)0x0,0,dnsrec,ares_query_dnsrec_cb,arg_00,
                                 qid);
      }
      ares_dns_record_destroy(dnsrec);
      return aVar1;
    }
  }
  (*callback)(arg,aVar1,0,(ares_dns_record_t *)0x0);
  return aVar1;
}

Assistant:

ares_status_t ares_query_nolock(ares_channel_t *channel, const char *name,
                                ares_dns_class_t     dnsclass,
                                ares_dns_rec_type_t  type,
                                ares_callback_dnsrec callback, void *arg,
                                unsigned short *qid)
{
  ares_status_t            status;
  ares_dns_record_t       *dnsrec = NULL;
  ares_dns_flags_t         flags  = 0;
  ares_query_dnsrec_arg_t *qquery = NULL;

  if (channel == NULL || name == NULL || callback == NULL) {
    /* LCOV_EXCL_START: DefensiveCoding */
    status = ARES_EFORMERR;
    if (callback != NULL) {
      callback(arg, status, 0, NULL);
    }
    return status;
    /* LCOV_EXCL_STOP */
  }

  if (!(channel->flags & ARES_FLAG_NORECURSE)) {
    flags |= ARES_FLAG_RD;
  }

  status = ares_dns_record_create_query(
    &dnsrec, name, dnsclass, type, 0, flags,
    (size_t)(channel->flags & ARES_FLAG_EDNS) ? channel->ednspsz : 0);
  if (status != ARES_SUCCESS) {
    callback(arg, status, 0, NULL); /* LCOV_EXCL_LINE: OutOfMemory */
    return status;                  /* LCOV_EXCL_LINE: OutOfMemory */
  }

  qquery = ares_malloc(sizeof(*qquery));
  if (qquery == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    status = ARES_ENOMEM;
    callback(arg, status, 0, NULL);
    ares_dns_record_destroy(dnsrec);
    return status;
    /* LCOV_EXCL_STOP */
  }

  qquery->callback = callback;
  qquery->arg      = arg;

  /* Send it off.  qcallback will be called when we get an answer. */
  status = ares_send_nolock(channel, NULL, 0, dnsrec, ares_query_dnsrec_cb,
                            qquery, qid);

  ares_dns_record_destroy(dnsrec);
  return status;
}